

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::Colour::use(Code _colourCode)

{
  bool bVar1;
  int iVar2;
  undefined4 in_EDI;
  IColourImpl *local_28;
  
  if (use(Catch::Colour::Code)::impl == '\0') {
    iVar2 = __cxa_guard_acquire(&use(Catch::Colour::Code)::impl);
    if (iVar2 != 0) {
      bVar1 = isDebuggerActive();
      if (bVar1) {
        local_28 = anon_unknown_22::NoColourImpl::instance();
      }
      else {
        local_28 = anon_unknown_22::platformColourInstance();
      }
      use::impl = local_28;
      __cxa_guard_release(&use(Catch::Colour::Code)::impl);
    }
  }
  (**(code **)(*(long *)use::impl + 0x10))(use::impl,in_EDI);
  return;
}

Assistant:

void Colour::use( Code _colourCode ) {
        static IColourImpl* impl = isDebuggerActive()
            ? NoColourImpl::instance()
            : platformColourInstance();
        impl->use( _colourCode );
    }